

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

Id dxil_spv::build_constant_expression(Impl *impl,ConstantExpr *cexpr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  TypeID TVar6;
  Id IVar7;
  Id IVar8;
  StorageClass SVar9;
  ValueKind VVar10;
  uint uVar11;
  Id IVar12;
  Type *pTVar13;
  Constant *pCVar14;
  Operation *pOVar15;
  Builder *pBVar16;
  Value *pVVar17;
  APInt *pAVar18;
  uint64_t uVar19;
  Constant *pCVar20;
  LoggingCallback p_Var21;
  ConstantExpr *pCVar22;
  void *pvVar23;
  Type *pTVar24;
  Type *pTVar25;
  mapped_type *pmVar26;
  mapped_type *pmVar27;
  bool is_signed;
  int iVar28;
  Id unaff_EBP;
  uint uVar29;
  char cVar30;
  Op op;
  ulong uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  char buffer [4096];
  Op local_106c;
  uint64_t local_1068;
  undefined1 local_1040 [8];
  initializer_list<unsigned_int> local_1038;
  undefined1 uStack_1028;
  undefined4 uStack_1027;
  undefined4 uStack_1023;
  uint uStack_101f;
  undefined2 uStack_101b;
  undefined4 uStack_1019;
  undefined5 uStack_1015;
  undefined6 uStack_1010;
  undefined1 uStack_100a;
  undefined1 uStack_1009;
  undefined6 uStack_1008;
  undefined1 uStack_1002;
  undefined1 uStack_1001;
  undefined6 uStack_1000;
  
  uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  if (0x11 < uVar5 - 0x12d) {
    if (0xc < uVar5 - 0x65) {
      if (uVar5 != 200) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
        local_1038._M_array = (iterator)0x206e776f6e6b6e55;
        local_1038._M_len._0_1_ = 'c';
        local_1038._M_len._1_1_ = 'o';
        local_1038._M_len._2_2_ = 0x736e;
        local_1038._M_len._4_1_ = 't';
        local_1038._M_len._5_1_ = 'a';
        local_1038._M_len._6_1_ = 'n';
        local_1038._M_len._7_1_ = 't';
        uStack_1028 = 0x2d;
        uStack_1027 = 0x72707865;
        uStack_1023._0_3_ = 0xa2e;
        goto LAB_00155615;
      }
      pBVar16 = Converter::Impl::builder(impl);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      pTVar13 = LLVMBC::Type::getPointerElementType(pTVar13);
      IVar8 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar8 = resolve_llvm_actual_value_type(impl,(Value *)cexpr,&pCVar14->super_Value,IVar8);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      SVar9 = spv::Builder::getStorageClass(pBVar16,IVar7);
      SVar9 = Converter::Impl::get_effective_storage_class(impl,&pCVar14->super_Value,SVar9);
      IVar8 = spv::Builder::makePointer(pBVar16,SVar9,IVar8);
      pOVar15 = Converter::Impl::allocate(impl,OpAccessChain,IVar8);
      Operation::add_id(pOVar15,IVar7);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
      pVVar17 = LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
      VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
      if (VVar10 != ConstantInt) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
LAB_001555ea:
        uStack_1015 = 0x74736e6f63;
        uStack_1010 = 0x2e3020746e61;
        uStack_100a = 10;
        uStack_1009 = 0;
        uStack_1028 = 0x50;
        uStack_1027 = 0x6f207274;
        uStack_1023 = 0x61726570;
        uStack_101f = 0x6920646e;
        uStack_101b = 0x2073;
        uStack_1019 = 0x20746f6e;
        uVar32._0_1_ = 'F';
        uVar32._1_1_ = 'i';
        uVar32._2_1_ = 'r';
        uVar32._3_1_ = 's';
        uVar33._0_1_ = 't';
        uVar33._1_1_ = ' ';
        uVar33._2_1_ = 'G';
        uVar33._3_1_ = 'e';
        uVar34._0_1_ = 't';
        uVar34._1_1_ = 'E';
        uVar34._2_1_ = 'l';
        uVar34._3_1_ = 'e';
        local_1038._M_len._4_1_ = 'm';
        local_1038._M_len._5_1_ = 'e';
        local_1038._M_len._6_1_ = 'n';
        local_1038._M_len._7_1_ = 't';
        goto LAB_00155611;
      }
      pCVar14 = (Constant *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
      VVar10 = LLVMBC::Value::get_value_kind((Value *)pCVar14);
      if (VVar10 != ConstantInt) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          std::terminate();
        }
        goto LAB_0015610e;
      }
      pAVar18 = LLVMBC::Constant::getUniqueInteger(pCVar14);
      uVar19 = LLVMBC::APInt::getZExtValue(pAVar18);
      if (uVar19 != 0) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
        goto LAB_001555ea;
      }
      uVar5 = LLVMBC::ConstantExpr::getNumOperands(cexpr);
      if (2 < uVar5) {
        uVar29 = 2;
        do {
          pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,uVar29);
          IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
          Operation::add_id(pOVar15,IVar7);
          uVar29 = uVar29 + 1;
        } while (uVar5 != uVar29);
      }
LAB_00155e90:
      Converter::Impl::add(impl,pOVar15,false);
      goto LAB_00155d1f;
    }
    uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
    if (uVar5 == 0x6c) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 != FloatTyID) goto LAB_00154e77;
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if ((TVar6 != HalfTyID) ||
         (bVar2 = Converter::Impl::support_native_fp16_operations(impl), bVar2)) goto LAB_00154e77;
      cVar30 = (impl->options).arithmetic_relaxed_precision;
      bVar2 = true;
    }
    else {
      if (uVar5 == 0x6d) {
        pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if (TVar6 == FloatTyID) {
          pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
          pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
          TVar6 = LLVMBC::Type::getTypeID(pTVar13);
          if ((TVar6 == HalfTyID) &&
             (bVar2 = Converter::Impl::support_native_fp16_operations(impl), !bVar2)) {
            bVar2 = true;
            cVar30 = '\0';
            goto LAB_00154e7c;
          }
        }
      }
LAB_00154e77:
      cVar30 = '\0';
      bVar2 = false;
    }
LAB_00154e7c:
    if (bVar2) {
      if (cVar30 != '\0') {
        pOVar15 = Converter::Impl::allocate(impl,OpCopyObject,(Value *)cexpr);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
        Operation::add_id(pOVar15,IVar7);
        Converter::Impl::add(impl,pOVar15,false);
        IVar7 = pOVar15->id;
        pBVar16 = Converter::Impl::builder(impl);
        spv::Builder::addDecoration(pBVar16,IVar7,DecorationRelaxedPrecision,-1);
        return IVar7;
      }
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      goto LAB_00155c29;
    }
    uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
    switch(uVar5) {
    case 0x65:
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
        pBVar16 = Converter::Impl::builder(impl);
        pOVar15 = Converter::Impl::allocate(impl,OpINotEqual,(Value *)cexpr);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        IVar7 = build_naturally_extended_value(impl,&pCVar14->super_Value,false);
        Operation::add_id(pOVar15,IVar7);
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
        pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
        uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
        if ((0x3f < uVar5 - 1) || ((0x8000000080008081U >> ((ulong)(uVar5 - 1) & 0x3f) & 1) == 0)) {
          uVar5 = (uint)(0x20 < uVar5) * 0x20 + 0x20;
        }
        if (uVar5 == 0x40) {
          IVar7 = spv::Builder::makeIntegerType(pBVar16,0x40,false);
          IVar7 = spv::Builder::makeInt64Constant(pBVar16,IVar7,0,false);
        }
        else {
          if (uVar5 == 0x20) {
            iVar28 = 0x20;
          }
          else {
            if (uVar5 != 0x10) {
              return 0;
            }
            iVar28 = 0x10;
          }
          IVar7 = spv::Builder::makeIntegerType(pBVar16,iVar28,false);
          IVar7 = spv::Builder::makeIntConstant(pBVar16,IVar7,0,false);
        }
        Operation::add_id(pOVar15,IVar7);
        goto LAB_00155e90;
      }
      goto LAB_00155951;
    case 0x66:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
LAB_00155459:
        bVar2 = false;
LAB_00155491:
        IVar7 = emit_boolean_convert_instruction<LLVMBC::ConstantExpr>(impl,cexpr,bVar2);
        return IVar7;
      }
LAB_00155951:
      IVar7 = emit_masked_cast_instruction<LLVMBC::ConstantExpr>(impl,cexpr,OpUConvert);
      if (IVar7 != 0) {
        return IVar7;
      }
      local_106c = OpUConvert;
      bVar2 = false;
      break;
    case 0x67:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) {
LAB_00155486:
        bVar2 = true;
        goto LAB_00155491;
      }
      IVar7 = emit_masked_cast_instruction<LLVMBC::ConstantExpr>(impl,cexpr,OpSConvert);
      if (IVar7 != 0) {
        return IVar7;
      }
      local_106c = OpSConvert;
      bVar2 = true;
      break;
    case 0x68:
      local_106c = OpConvertFToU;
      goto LAB_001554c3;
    case 0x69:
      local_106c = OpConvertFToS;
      goto LAB_001554c3;
    case 0x6a:
      bVar2 = false;
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) goto LAB_00155459;
      local_106c = OpConvertUToF;
      break;
    case 0x6b:
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
      if (uVar5 == 1) goto LAB_00155486;
      bVar2 = true;
      local_106c = OpConvertSToF;
      break;
    case 0x6c:
    case 0x6d:
      local_106c = OpFConvert;
      cVar30 = '\x01';
      goto LAB_001554c3;
    default:
      p_Var21 = get_thread_log_callback();
      if (p_Var21 == (LoggingCallback)0x0) {
        build_constant_expression();
        return 0;
      }
      uStack_1028 = 0x72;
      uStack_1027 = 0x6f697461;
      uStack_1023 = 0xa2e6e;
      uVar32._0_1_ = 'U';
      uVar32._1_1_ = 'n';
      uVar32._2_1_ = 'k';
      uVar32._3_1_ = 'n';
      uVar33._0_1_ = 'o';
      uVar33._1_1_ = 'w';
      uVar33._2_1_ = 'n';
      uVar33._3_1_ = ' ';
      uVar34._0_1_ = 'c';
      uVar34._1_1_ = 'a';
      uVar34._2_1_ = 's';
      uVar34._3_1_ = 't';
      local_1038._M_len._4_1_ = ' ';
      local_1038._M_len._5_1_ = 'o';
      local_1038._M_len._6_1_ = 'p';
      local_1038._M_len._7_1_ = 'e';
      goto LAB_00155611;
    case 0x70:
      local_106c = OpBitcast;
LAB_001554c3:
      bVar2 = false;
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    if (TVar6 == PointerTyID) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      uVar5 = LLVMBC::Type::getPointerAddressSpace(pTVar13);
      if ((char)uVar5 != '\x03') goto LAB_00155764;
      uVar5 = 0;
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pVVar17 = LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
      VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
      if (VVar10 == ConstantExpr) {
        local_1068 = 0;
        do {
          pCVar22 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
          VVar10 = LLVMBC::Value::get_value_kind((Value *)pCVar22);
          if (VVar10 != ConstantExpr) {
            p_Var21 = get_thread_log_callback();
            if (p_Var21 == (LoggingCallback)0x0) {
              build_constant_expression();
              std::terminate();
            }
            goto LAB_0015610e;
          }
          uVar29 = LLVMBC::ConstantExpr::getOpcode(pCVar22);
          if ((uVar29 == 200) &&
             (uVar29 = LLVMBC::ConstantExpr::getNumOperands(pCVar22), uVar29 == 3)) {
            pCVar20 = LLVMBC::ConstantExpr::getOperand(pCVar22,2);
            pAVar18 = LLVMBC::Constant::getUniqueInteger(pCVar20);
            local_1068 = LLVMBC::APInt::getZExtValue(pAVar18);
          }
          pCVar22 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
          VVar10 = LLVMBC::Value::get_value_kind((Value *)pCVar22);
          if (VVar10 != ConstantExpr) {
            p_Var21 = get_thread_log_callback();
            if (p_Var21 == (LoggingCallback)0x0) {
              build_constant_expression();
              std::terminate();
            }
            goto LAB_0015610e;
          }
          pCVar14 = LLVMBC::ConstantExpr::getOperand(pCVar22,0);
          pVVar17 = LLVMBC::Internal::resolve_proxy(&pCVar14->super_Value);
          VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
        } while (VVar10 == ConstantExpr);
      }
      else {
        local_1068 = 0;
      }
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      pTVar13 = LLVMBC::Type::getPointerElementType(pTVar13);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 == ArrayTyID) {
        uVar5 = 0;
        do {
          uVar5 = uVar5 + 1;
          pTVar13 = LLVMBC::Type::getArrayElementType(pTVar13);
          TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        } while (TVar6 == ArrayTyID);
      }
      pTVar24 = LLVMBC::Value::getType((Value *)cexpr);
      pTVar24 = LLVMBC::Type::getPointerElementType(pTVar24);
      TVar6 = LLVMBC::Type::getTypeID(pTVar24);
      uVar29 = 0;
      if (TVar6 == ArrayTyID) {
        uVar29 = 0;
        do {
          uVar29 = uVar29 + 1;
          pTVar24 = LLVMBC::Type::getArrayElementType(pTVar24);
          TVar6 = LLVMBC::Type::getTypeID(pTVar24);
        } while (TVar6 == ArrayTyID);
      }
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      bVar1 = true;
      if ((TVar6 == IntegerTyID) &&
         (uVar11 = LLVMBC::Type::getIntegerBitWidth(pTVar13), uVar11 == 8)) {
        if ((local_1068 & 3) == 0) {
          pBVar16 = Converter::Impl::builder(impl);
          uVar11 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
          iVar28 = uVar5 - uVar29;
          if (uVar29 <= uVar5 && iVar28 != 0) {
            IVar7 = spv::Builder::makeIntegerType(pBVar16,0x20,false);
            IVar7 = spv::Builder::makePointer(pBVar16,StorageClassWorkgroup,IVar7);
            pOVar15 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar7);
            Operation::add_id(pOVar15,uVar11);
            uVar31 = local_1068 >> 2 & 0x3fffffff;
            do {
              IVar7 = spv::Builder::makeIntegerType(pBVar16,0x20,false);
              IVar7 = spv::Builder::makeIntConstant(pBVar16,IVar7,(uint)uVar31,false);
              Operation::add_id(pOVar15,IVar7);
              uVar31 = 0;
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
            Converter::Impl::add(impl,pOVar15,false);
            uVar11 = pOVar15->id;
          }
          pTVar13 = (Type *)(ulong)uVar11;
          Converter::Impl::rewrite_value(impl,(Value *)cexpr,uVar11);
          bVar1 = false;
          IVar7 = spv::Builder::makeIntegerType(pBVar16,0x20,false);
          local_1038._M_array = (iterator)cexpr;
          pmVar26 = std::__detail::
                    _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&impl->llvm_value_actual_type,(key_type *)&local_1038);
          *pmVar26 = IVar7;
        }
        else {
          p_Var21 = get_thread_log_callback();
          if (p_Var21 == (LoggingCallback)0x0) {
            build_constant_expression();
          }
          else {
            uStack_1015 = 0x66666f2070;
            uStack_1010 = 0x6f6620746573;
            uStack_100a = 0x72;
            uStack_1028 = 0x61;
            uStack_1027 = 0x6e67696c;
            uStack_1023 = 0x63206465;
            uStack_101f = 0x74736e6f;
            uStack_101b = 0x6e61;
            uStack_1019 = 0x65672074;
            local_1038._M_array = (iterator)0x6465746365707845;
            local_1038._M_len._0_1_ = 0x20;
            local_1038._M_len._1_1_ = 0x34;
            local_1038._M_len._2_2_ = 0x6220;
            local_1038._M_len._4_4_ = 0x20657479;
            uStack_1009 = 0x20;
            uStack_1008._0_4_ = 0x4d534754;
            uStack_1008._4_2_ = 0xa2e;
            uStack_1002 = 0;
            pvVar23 = get_thread_log_callback_userdata();
            (*p_Var21)(pvVar23,Error,(char *)&local_1038);
          }
          bVar1 = false;
          pTVar13 = (Type *)0x0;
        }
      }
      IVar7 = (Id)pTVar13;
      if (bVar1) goto LAB_00155764;
    }
    else {
LAB_00155764:
      IVar7 = 0;
    }
    if (IVar7 != 0) {
      return IVar7;
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    if (TVar6 == PointerTyID) {
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pTVar13 = LLVMBC::Value::getType(&pCVar14->super_Value);
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      if (TVar6 != PointerTyID) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          std::terminate();
        }
LAB_0015610e:
        uStack_1028 = 0x69;
        uStack_1027 = 0x6163206e;
        uStack_1023 = 0x543c7473;
        uStack_101f = 0xa2e3e;
        local_1038._M_array = (iterator)0x2064696c61766e49;
        local_1038._M_len._0_1_ = 0x74;
        local_1038._M_len._1_1_ = 0x79;
        local_1038._M_len._2_2_ = 0x6570;
        local_1038._M_len._4_4_ = 0x20444920;
        pvVar23 = get_thread_log_callback_userdata();
        (*p_Var21)(pvVar23,Error,(char *)&local_1038);
        std::terminate();
      }
      pTVar24 = LLVMBC::Type::getPointerElementType(pTVar13);
      pTVar25 = LLVMBC::Value::getType((Value *)cexpr);
      TVar6 = LLVMBC::Type::getTypeID(pTVar25);
      if (TVar6 != PointerTyID) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          std::terminate();
        }
        goto LAB_0015610e;
      }
      pTVar25 = LLVMBC::Type::getPointerElementType(pTVar25);
      TVar6 = LLVMBC::Type::getTypeID(pTVar24);
      uVar29 = 0;
      uVar5 = 0;
      while (TVar6 == ArrayTyID) {
        pTVar24 = LLVMBC::Type::getArrayElementType(pTVar24);
        uVar5 = uVar5 + 1;
        TVar6 = LLVMBC::Type::getTypeID(pTVar24);
      }
      TVar6 = LLVMBC::Type::getTypeID(pTVar25);
      if (TVar6 == ArrayTyID) {
        uVar29 = 0;
        do {
          pTVar25 = LLVMBC::Type::getArrayElementType(pTVar25);
          uVar29 = uVar29 + 1;
          TVar6 = LLVMBC::Type::getTypeID(pTVar25);
        } while (TVar6 == ArrayTyID);
      }
      TVar6 = LLVMBC::Type::getTypeID(pTVar24);
      if ((TVar6 == PointerTyID) || (TVar6 = LLVMBC::Type::getTypeID(pTVar25), TVar6 == PointerTyID)
         ) {
        p_Var21 = get_thread_log_callback();
        if (p_Var21 == (LoggingCallback)0x0) {
          build_constant_expression();
          return 0;
        }
        uStack_1028 = 0x69;
        uStack_1027 = 0x7265746e;
        uStack_1023 = 0x2d6f742d;
        uStack_101f = 0x6e696f70;
        uStack_101b = 0x6574;
        local_1038._M_array = (iterator)0x6820746f6e6e6143;
        local_1038._M_len._0_1_ = 'a';
        local_1038._M_len._1_1_ = 'n';
        local_1038._M_len._2_2_ = 0x6c64;
        local_1038._M_len._4_1_ = 'e';
        local_1038._M_len._5_1_ = ' ';
        local_1038._M_len._6_1_ = 'p';
        local_1038._M_len._7_1_ = 'o';
        uStack_1019 = 0xa2e72;
        goto LAB_00155615;
      }
      IVar7 = Converter::Impl::get_type_id(impl,pTVar24,0);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar8 = resolve_llvm_actual_value_type(impl,(Value *)cexpr,&pCVar14->super_Value,IVar7);
      uVar11 = LLVMBC::Type::getAddressSpace(pTVar13);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      SVar9 = Converter::Impl::get_effective_storage_class
                        (impl,&pCVar14->super_Value,
                         (uint)((char)uVar11 != '\x03') * 3 + StorageClassWorkgroup);
      pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
      if (uVar29 == uVar5) {
        pVVar17 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
        VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
        if (VVar10 == ConstantExpr) goto LAB_00156059;
        pBVar16 = Converter::Impl::builder(impl);
        IVar12 = spv::Builder::makePointer(pBVar16,SVar9,IVar8);
        pOVar15 = Converter::Impl::allocate(impl,OpCopyObject,(Value *)cexpr,IVar12);
        Operation::add_id(pOVar15,IVar7);
      }
      else {
        if (uVar5 < uVar29) {
          p_Var21 = get_thread_log_callback();
          if (p_Var21 == (LoggingCallback)0x0) {
            build_constant_expression();
            return 0;
          }
          uStack_1015 = 0x7272612065;
          uStack_1010 = 0x6d6964207961;
          uStack_100a = 0x65;
          uStack_1009 = 0x6e;
          uStack_1028 = 0x65;
          uStack_1027 = 0x68772072;
          uStack_1023 = 0x20656c69;
          uStack_101f = 0x69646461;
          uStack_101b = 0x676e;
          uStack_1019 = 0x726f6d20;
          local_1038._M_array = (iterator)0x6974736163746942;
          local_1038._M_len._0_1_ = 'n';
          local_1038._M_len._1_1_ = 'g';
          local_1038._M_len._2_2_ = 0x7020;
          local_1038._M_len._4_1_ = 'o';
          local_1038._M_len._5_1_ = 'i';
          local_1038._M_len._6_1_ = 'n';
          local_1038._M_len._7_1_ = 't';
          uStack_1008._0_4_ = 0x6e6f6973;
          uStack_1008._4_2_ = 0x2e73;
          uStack_1002 = 10;
          uStack_1001 = 0;
LAB_00155615:
          pvVar23 = get_thread_log_callback_userdata();
          (*p_Var21)(pvVar23,Error,(char *)&local_1038);
          return 0;
        }
        if (uVar29 != 0) {
          p_Var21 = get_thread_log_callback();
          if (p_Var21 == (LoggingCallback)0x0) {
            build_constant_expression();
            return 0;
          }
          uStack_1008._0_4_ = 0x6d696420;
          uStack_1008._4_2_ = 0x6e65;
          uStack_1002 = 0x73;
          uStack_1001 = 0x69;
          uStack_1000 = 0xa2e736e6f;
          uStack_1015 = 0x207265626d;
          uStack_1010 = 0x72726120666f;
          uStack_100a = 0x61;
          uStack_1009 = 0x79;
          uStack_1028 = 0x65;
          uStack_1027 = 0x6f742072;
          uStack_1023 = 0x656e7520;
          uStack_101f = 0x63657078;
          uStack_101b = 0x6574;
          uStack_1019 = 0x756e2064;
          uVar32._0_1_ = 'B';
          uVar32._1_1_ = 'i';
          uVar32._2_1_ = 't';
          uVar32._3_1_ = 'c';
          uVar33._0_1_ = 'a';
          uVar33._1_1_ = 's';
          uVar33._2_1_ = 't';
          uVar33._3_1_ = 'i';
          uVar34._0_1_ = 'n';
          uVar34._1_1_ = 'g';
          uVar34._2_1_ = ' ';
          uVar34._3_1_ = 'p';
          local_1038._M_len._4_1_ = 'o';
          local_1038._M_len._5_1_ = 'i';
          local_1038._M_len._6_1_ = 'n';
          local_1038._M_len._7_1_ = 't';
LAB_00155611:
          local_1038._M_array = (iterator)CONCAT44(uVar33,uVar32);
          local_1038._M_len._0_1_ = (char)uVar34;
          local_1038._M_len._1_1_ = SUB41(uVar34,1);
          local_1038._M_len._2_2_ = SUB42(uVar34,2);
          goto LAB_00155615;
        }
        pBVar16 = Converter::Impl::builder(impl);
        IVar12 = spv::Builder::makePointer(pBVar16,SVar9,IVar8);
        pOVar15 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar12);
        Operation::add_id(pOVar15,IVar7);
        for (; uVar5 != 0; uVar5 = uVar5 - 1) {
          pBVar16 = Converter::Impl::builder(impl);
          IVar7 = spv::Builder::makeIntegerType(pBVar16,0x20,false);
          IVar7 = spv::Builder::makeIntConstant(pBVar16,IVar7,0,false);
          Operation::add_id(pOVar15,IVar7);
        }
      }
      Converter::Impl::add(impl,pOVar15,false);
      IVar7 = pOVar15->id;
LAB_00156059:
      local_1038._M_array = (iterator)cexpr;
      pmVar26 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_value_actual_type,(key_type *)&local_1038);
      *pmVar26 = IVar8;
      local_1038._M_array = (iterator)cexpr;
      pmVar27 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_storage_class,(key_type *)&local_1038);
      *pmVar27 = SVar9;
      return IVar7;
    }
    pVVar17 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
    VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
    if (VVar10 == ConstantExpr) {
      pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
      IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
      pOVar15 = Converter::Impl::allocate(impl,local_106c,IVar7);
    }
    else {
      pOVar15 = Converter::Impl::allocate(impl,local_106c,(Value *)cexpr);
    }
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
    IVar7 = build_naturally_extended_value(impl,&pCVar14->super_Value,bVar2);
    Operation::add_id(pOVar15,IVar7);
    Converter::Impl::add(impl,pOVar15,false);
    if (cVar30 == '\0') goto LAB_00155d1f;
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    IVar7 = pOVar15->id;
    goto LAB_00155d15;
  }
  uVar5 = LLVMBC::ConstantExpr::getOpcode(cexpr);
  switch(uVar5) {
  case 0x12d:
    op = OpIAdd;
    break;
  case 0x12e:
    bVar2 = true;
    op = OpFAdd;
    goto LAB_00155b7b;
  case 0x12f:
    op = OpISub;
    break;
  case 0x130:
    bVar2 = true;
    op = OpFSub;
    goto LAB_00155b7b;
  case 0x131:
    op = OpIMul;
    break;
  case 0x132:
    bVar2 = true;
    op = OpFMul;
    goto LAB_00155b7b;
  case 0x133:
    op = OpUDiv;
    goto LAB_0015525e;
  case 0x134:
    op = OpSDiv;
    goto LAB_001552a8;
  case 0x135:
    bVar2 = true;
    op = OpFDiv;
    goto LAB_00155b7b;
  case 0x136:
    op = OpUMod;
    goto LAB_0015525e;
  case 0x137:
    op = OpSRem;
    goto LAB_001552a8;
  case 0x138:
    bVar2 = true;
    op = OpFRem;
    goto LAB_00155b7b;
  case 0x139:
    op = OpShiftLeftLogical;
    break;
  case 0x13a:
    op = OpShiftRightLogical;
LAB_0015525e:
    bVar1 = true;
    bVar2 = false;
    goto LAB_00155b83;
  case 0x13b:
    op = OpShiftRightArithmetic;
LAB_001552a8:
    bVar1 = true;
    bVar2 = false;
    is_signed = true;
    goto LAB_00155b85;
  case 0x13c:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    op = (uint)(uVar5 != 1) * 0x20 + OpLogicalAnd;
    break;
  case 0x13d:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    op = OpBitwiseOr;
    if (uVar5 == 1) {
      op = OpLogicalOr;
    }
    break;
  case 0x13e:
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar13);
    if (uVar5 == 1) {
      pCVar20 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
      pCVar14 = (Constant *)0x0;
      if (pCVar20 != (Constant *)0x0) {
        pCVar20 = (Constant *)LLVMBC::Internal::resolve_proxy(&pCVar20->super_Value);
        VVar10 = LLVMBC::Value::get_value_kind((Value *)pCVar20);
        pCVar14 = (Constant *)0x0;
        if (VVar10 == ConstantInt) {
          pCVar14 = pCVar20;
        }
      }
      if (pCVar14 == (Constant *)0x0) {
        pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
        pCVar14 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(&pCVar14->super_Value)->super_Constant;
        if (pCVar14 == (Constant *)0x0) goto LAB_00155ad5;
        pAVar18 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar19 = LLVMBC::APInt::getZExtValue(pAVar18);
        uVar5 = 0;
        IVar7 = 0;
        if (uVar19 != 0) goto LAB_00155ab8;
      }
      else {
        pAVar18 = LLVMBC::Constant::getUniqueInteger(pCVar14);
        uVar19 = LLVMBC::APInt::getZExtValue(pAVar18);
        uVar5 = 1;
        if (uVar19 == 0) {
LAB_00155ad5:
          IVar7 = 0;
        }
        else {
LAB_00155ab8:
          pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,uVar5);
          IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
        }
      }
      if (IVar7 == 0) {
        op = OpLogicalNotEqual;
      }
      else {
        pVVar17 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
        VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
        if (VVar10 == ConstantExpr) {
          pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
          IVar8 = Converter::Impl::get_type_id(impl,pTVar13,0);
          pOVar15 = Converter::Impl::allocate(impl,OpLogicalNot,IVar8);
        }
        else {
          pOVar15 = Converter::Impl::allocate(impl,OpLogicalNot,(Value *)cexpr);
        }
        Operation::add_id(pOVar15,IVar7);
        Converter::Impl::add(impl,pOVar15,false);
        unaff_EBP = pOVar15->id;
        op = OpLogicalNot;
      }
      if (IVar7 != 0) {
        return unaff_EBP;
      }
    }
    else {
      op = OpBitwiseXor;
    }
    break;
  default:
    p_Var21 = get_thread_log_callback();
    if (p_Var21 == (LoggingCallback)0x0) {
      build_constant_expression();
      return 0;
    }
    uStack_1028 = 0x70;
    uStack_1027 = 0x74617265;
    uStack_1023 = 0xa2e726f;
    uStack_101f = uStack_101f & 0xffffff00;
    uVar32._0_1_ = 'U';
    uVar32._1_1_ = 'n';
    uVar32._2_1_ = 'k';
    uVar32._3_1_ = 'n';
    uVar33._0_1_ = 'o';
    uVar33._1_1_ = 'w';
    uVar33._2_1_ = 'n';
    uVar33._3_1_ = ' ';
    uVar34._0_1_ = 'b';
    uVar34._1_1_ = 'i';
    uVar34._2_1_ = 'n';
    uVar34._3_1_ = 'a';
    local_1038._M_len._4_1_ = 'r';
    local_1038._M_len._5_1_ = 'y';
    local_1038._M_len._6_1_ = ' ';
    local_1038._M_len._7_1_ = 'o';
    goto LAB_00155611;
  }
  bVar2 = false;
LAB_00155b7b:
  bVar1 = false;
LAB_00155b83:
  is_signed = false;
LAB_00155b85:
  IVar7 = 0;
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
  bVar3 = instruction_is_undefined_value(&pCVar14->super_Value);
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
  bVar4 = instruction_is_undefined_value(&pCVar14->super_Value);
  if ((bVar4) || (bVar3)) {
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,(uint)!bVar4);
    IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
  }
  pVVar17 = LLVMBC::Internal::resolve_proxy((Value *)cexpr);
  VVar10 = LLVMBC::Value::get_value_kind(pVVar17);
  if (VVar10 == ConstantExpr) {
    if (IVar7 != 0) {
      return IVar7;
    }
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
    pOVar15 = Converter::Impl::allocate(impl,op,IVar7);
  }
  else {
    if (IVar7 != 0) {
LAB_00155c29:
      Converter::Impl::rewrite_value(impl,(Value *)cexpr,IVar7);
      return IVar7;
    }
    pOVar15 = Converter::Impl::allocate(impl,op,(Value *)cexpr);
  }
  pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,0);
  if (bVar1) {
    IVar7 = build_naturally_extended_value(impl,&pCVar14->super_Value,is_signed);
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
    local_1040._4_4_ = build_naturally_extended_value(impl,&pCVar14->super_Value,is_signed);
  }
  else {
    IVar7 = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
    pCVar14 = LLVMBC::ConstantExpr::getOperand(cexpr,1);
    local_1040._4_4_ = Converter::Impl::get_id_for_value(impl,&pCVar14->super_Value,0);
  }
  local_1038._M_array = (iterator)local_1040;
  local_1038._M_len._0_1_ = 2;
  local_1038._M_len._1_1_ = 0;
  local_1038._M_len._2_2_ = 0;
  local_1038._M_len._4_4_ = 0;
  local_1040._0_4_ = IVar7;
  Operation::add_ids(pOVar15,&local_1038);
  Converter::Impl::add(impl,pOVar15,false);
  if (bVar2) {
    pBVar16 = Converter::Impl::builder(impl);
    spv::Builder::addDecoration(pBVar16,pOVar15->id,DecorationNoContraction,-1);
    pTVar13 = LLVMBC::Value::getType((Value *)cexpr);
    IVar7 = pOVar15->id;
LAB_00155d15:
    Converter::Impl::decorate_relaxed_precision(impl,pTVar13,IVar7,false);
  }
LAB_00155d1f:
  return pOVar15->id;
}

Assistant:

spv::Id build_constant_expression(Converter::Impl &impl, const llvm::ConstantExpr *cexpr)
{
	switch (cexpr->getOpcode())
	{
	case llvm::Instruction::GetElementPtr:
		return build_constant_getelementptr(impl, cexpr);

	case llvm::Instruction::Trunc:
	case llvm::Instruction::ZExt:
	case llvm::Instruction::SExt:
	case llvm::Instruction::FPToUI:
	case llvm::Instruction::FPToSI:
	case llvm::Instruction::UIToFP:
	case llvm::Instruction::SIToFP:
	case llvm::Instruction::FPTrunc:
	case llvm::Instruction::FPExt:
	case llvm::Instruction::PtrToInt:
	case llvm::Instruction::IntToPtr:
	case llvm::Instruction::BitCast:
	case llvm::Instruction::AddrSpaceCast:
		return build_constant_cast(impl, cexpr);

	case llvm::Instruction::Add:
	case llvm::Instruction::FAdd:
	case llvm::Instruction::Sub:
	case llvm::Instruction::FSub:
	case llvm::Instruction::Mul:
	case llvm::Instruction::FMul:
	case llvm::Instruction::UDiv:
	case llvm::Instruction::SDiv:
	case llvm::Instruction::FDiv:
	case llvm::Instruction::URem:
	case llvm::Instruction::SRem:
	case llvm::Instruction::FRem:
	case llvm::Instruction::Shl:
	case llvm::Instruction::LShr:
	case llvm::Instruction::AShr:
	case llvm::Instruction::And:
	case llvm::Instruction::Or:
	case llvm::Instruction::Xor:
		return emit_binary_instruction_impl(impl, cexpr);

	default:
	{
		LOGE("Unknown constant-expr.\n");
		break;
	}
	}

	return 0;
}